

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function-c.cpp
# Opt level: O3

void duckdb_aggregate_function_set_functions
               (duckdb_aggregate_function function,duckdb_aggregate_state_size state_size,
               duckdb_aggregate_init_t state_init,duckdb_aggregate_update_t update,
               duckdb_aggregate_combine_t combine,duckdb_aggregate_finalize_t finalize)

{
  AggregateFunctionInfo *pAVar1;
  int iVar2;
  undefined1 auVar3 [16];
  
  auVar3._0_4_ = -(uint)(function == (duckdb_aggregate_function)0x0);
  auVar3._4_4_ = -(uint)(state_size == (duckdb_aggregate_state_size)0x0);
  auVar3._8_4_ = -(uint)(state_init == (duckdb_aggregate_init_t)0x0);
  auVar3._12_4_ = -(uint)(update == (duckdb_aggregate_update_t)0x0);
  iVar2 = movmskps((int)state_init,auVar3);
  if ((finalize != (duckdb_aggregate_finalize_t)0x0 && combine != (duckdb_aggregate_combine_t)0x0)
      && iVar2 == 0) {
    pAVar1 = duckdb::shared_ptr<duckdb::AggregateFunctionInfo,_true>::operator->
                       ((shared_ptr<duckdb::AggregateFunctionInfo,_true> *)(function + 0x120));
    pAVar1[1]._vptr_AggregateFunctionInfo = (_func_int **)state_size;
    pAVar1[2]._vptr_AggregateFunctionInfo = (_func_int **)state_init;
    pAVar1[3]._vptr_AggregateFunctionInfo = (_func_int **)update;
    pAVar1[4]._vptr_AggregateFunctionInfo = (_func_int **)combine;
    pAVar1[5]._vptr_AggregateFunctionInfo = (_func_int **)finalize;
  }
  return;
}

Assistant:

void duckdb_aggregate_function_set_functions(duckdb_aggregate_function function, duckdb_aggregate_state_size state_size,
                                             duckdb_aggregate_init_t state_init, duckdb_aggregate_update_t update,
                                             duckdb_aggregate_combine_t combine, duckdb_aggregate_finalize_t finalize) {
	if (!function || !state_size || !state_init || !update || !combine || !finalize) {
		return;
	}
	auto &aggregate_function = GetCAggregateFunction(function);
	auto &function_info = aggregate_function.function_info->Cast<duckdb::CAggregateFunctionInfo>();
	function_info.state_size = state_size;
	function_info.state_init = state_init;
	function_info.update = update;
	function_info.combine = combine;
	function_info.finalize = finalize;
}